

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O3

void __thiscall
vkt::compute::anon_unknown_0::CopySSBOToImageTest::initPrograms
          (CopySSBOToImageTest *this,SourceCollections *sourceCollections)

{
  ostream *poVar1;
  ProgramSources *pPVar2;
  ostringstream src;
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  string local_1e0;
  uint local_1c0;
  value_type local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"#version 310 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"layout (local_size_x = ",0x17);
  poVar1 = (ostream *)std::ostream::operator<<(local_198,(this->m_localSize).m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", local_size_y = ",0x11);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_localSize).m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"layout(binding = 1, r32ui) writeonly uniform highp uimage2D u_dstImg;\n",0x46);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"layout(binding = 0) readonly buffer Input {\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    uint values[",0x10);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->m_imageSize).m_data[1] * (this->m_imageSize).m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"} sb_in;\n\n",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"void main (void) {\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"    uint stride = gl_NumWorkGroups.x*gl_WorkGroupSize.x;\n",0x39);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "    uint value  = sb_in.values[gl_GlobalInvocationID.y*stride + gl_GlobalInvocationID.x];\n"
             ,0x5a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "    imageStore(u_dstImg, ivec2(gl_GlobalInvocationID.xy), uvec4(value, 0, 0, 0));\n",
             0x52);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}\n",2);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"comp","");
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1e0);
  std::__cxx11::stringbuf::str();
  local_1c0 = 5;
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,local_200,local_1f8 + (long)local_200);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar2->sources + local_1c0,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200,local_1f0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void CopySSBOToImageTest::initPrograms (SourceCollections& sourceCollections) const
{
	std::ostringstream src;
	src << "#version 310 es\n"
		<< "layout (local_size_x = " << m_localSize.x() << ", local_size_y = " << m_localSize.y() << ") in;\n"
		<< "layout(binding = 1, r32ui) writeonly uniform highp uimage2D u_dstImg;\n"
		<< "layout(binding = 0) readonly buffer Input {\n"
		<< "    uint values[" << (m_imageSize.x() * m_imageSize.y()) << "];\n"
		<< "} sb_in;\n\n"
		<< "void main (void) {\n"
		<< "    uint stride = gl_NumWorkGroups.x*gl_WorkGroupSize.x;\n"
		<< "    uint value  = sb_in.values[gl_GlobalInvocationID.y*stride + gl_GlobalInvocationID.x];\n"
		<< "    imageStore(u_dstImg, ivec2(gl_GlobalInvocationID.xy), uvec4(value, 0, 0, 0));\n"
		<< "}\n";

	sourceCollections.glslSources.add("comp") << glu::ComputeSource(src.str());
}